

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::on_ip_change(session_impl *this,error_code *ec)

{
  uint uVar1;
  ip_change_notifier *piVar2;
  session_impl *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  long *local_40 [2];
  long local_30 [2];
  
  if (ec->failed_ == false) {
    session_log(this,"received ip change from internal ip_notifier");
  }
  else {
    uVar1 = ec->val_;
    (*ec->cat_->_vptr_error_category[4])(local_40,ec->cat_,(ulong)uVar1);
    session_log(this,"received error on_ip_change: %d, %s",(ulong)uVar1,local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  if (((ec->failed_ == false) && (this->m_abort == false)) &&
     (piVar2 = (this->m_ip_notifier)._M_t.
               super___uniq_ptr_impl<libtorrent::aux::ip_change_notifier,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::aux::ip_change_notifier_*,_std::default_delete<libtorrent::aux::ip_change_notifier>_>
               .super__Head_base<0UL,_libtorrent::aux::ip_change_notifier_*,_false>._M_head_impl,
     piVar2 != (ip_change_notifier *)0x0)) {
    uStack_60 = 0;
    pcStack_50 = ::std::
                 _Function_handler<void_(const_boost::system::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:1970:29)>
                 ::_M_invoke;
    local_58 = ::std::
               _Function_handler<void_(const_boost::system::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:1970:29)>
               ::_M_manager;
    local_68 = this;
    (**piVar2->_vptr_ip_change_notifier)();
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
    reopen_listen_sockets(this,false);
  }
  return;
}

Assistant:

void session_impl::on_ip_change(error_code const& ec)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (!ec)
			session_log("received ip change from internal ip_notifier");
		else
			session_log("received error on_ip_change: %d, %s", ec.value(), ec.message().c_str());
#endif
		if (ec || m_abort || !m_ip_notifier) return;
		m_ip_notifier->async_wait([this] (error_code const& e)
			{ wrap(&session_impl::on_ip_change, e); });
		reopen_network_sockets({});
	}